

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_lemire2(uint16_t *array,uint32_t len,uint32_t *flags)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  ulong uVar37;
  uint32_t *in_RDX;
  uint in_ESI;
  uint16_t *in_RDI;
  size_t k_1;
  __m256i eq_2;
  __m256i m_2;
  __m256i input_2;
  __m256i eq4_1;
  __m256i m4_1;
  __m256i input4_1;
  __m256i eq3_1;
  __m256i m3_1;
  __m256i input3_1;
  __m256i eq2_1;
  __m256i m2_1;
  __m256i input2_1;
  __m256i eq1_1;
  __m256i m1_1;
  __m256i input1_1;
  __m256i eq8;
  __m256i m8;
  __m256i input8;
  __m256i eq7;
  __m256i m7;
  __m256i input7;
  __m256i eq6;
  __m256i m6;
  __m256i input6;
  __m256i eq5;
  __m256i m5;
  __m256i input5;
  __m256i eq4;
  __m256i m4;
  __m256i input4;
  __m256i eq3;
  __m256i m3;
  __m256i input3;
  __m256i eq2;
  __m256i m2;
  __m256i input2;
  __m256i eq1;
  __m256i m1;
  __m256i input1;
  size_t maxj;
  size_t j;
  size_t i_2;
  size_t k;
  __m256i eq_1;
  __m256i m_1;
  __m256i input_1;
  size_t i_1;
  uint16_t startbuffer_1 [32];
  __m256i eq;
  __m256i m;
  __m256i input;
  size_t i;
  uint16_t startbuffer [32];
  __m256i count16;
  __m256i bits;
  uint16_t buffer [16];
  ulong local_13e8;
  ulong local_f00;
  ulong local_ef8;
  long local_ef0;
  ulong local_ee8;
  ulong local_e68;
  undefined8 local_e60 [8];
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  ulong local_da8;
  undefined8 local_da0 [7];
  undefined8 local_d68;
  undefined1 local_d60 [32];
  undefined1 local_d40 [16];
  undefined1 auStack_d30 [16];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  uint32_t *local_d00;
  uint local_cf4;
  uint16_t *local_cf0;
  undefined1 local_960 [16];
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 *local_8a8;
  undefined1 local_8a0 [32];
  undefined2 local_880;
  undefined2 local_87e;
  undefined2 local_87c;
  undefined2 local_87a;
  undefined2 local_878;
  undefined2 local_876;
  undefined2 local_874;
  undefined2 local_872;
  undefined2 local_870;
  undefined2 local_86e;
  undefined2 local_86c;
  undefined2 local_86a;
  undefined2 local_868;
  undefined2 local_866;
  undefined2 local_864;
  undefined2 local_862;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  local_862 = 0x8000;
  local_864 = 0x4000;
  local_866 = 0x2000;
  local_868 = 0x1000;
  local_86a = 0x800;
  local_86c = 0x400;
  local_86e = 0x200;
  local_870 = 0x100;
  local_872 = 0x80;
  local_874 = 0x40;
  local_876 = 0x20;
  local_878 = 0x10;
  local_87a = 8;
  local_87c = 4;
  local_87e = 2;
  local_880 = 1;
  auVar2 = vpinsrw_avx(ZEXT216(0x100),0x200,1);
  auVar2 = vpinsrw_avx(auVar2,0x400,2);
  auVar2 = vpinsrw_avx(auVar2,0x800,3);
  auVar2 = vpinsrw_avx(auVar2,0x1000,4);
  auVar2 = vpinsrw_avx(auVar2,0x2000,5);
  auVar2 = vpinsrw_avx(auVar2,0x4000,6);
  auVar2 = vpinsrw_avx(auVar2,0x8000,7);
  auVar3 = vpinsrw_avx(ZEXT216(1),2,1);
  auVar3 = vpinsrw_avx(auVar3,4,2);
  auVar3 = vpinsrw_avx(auVar3,8,3);
  auVar3 = vpinsrw_avx(auVar3,0x10,4);
  auVar3 = vpinsrw_avx(auVar3,0x20,5);
  auVar3 = vpinsrw_avx(auVar3,0x40,6);
  auVar3 = vpinsrw_avx(auVar3,0x80,7);
  local_8a0._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  local_8a0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  local_d40 = local_8a0._0_16_;
  auStack_d30 = local_8a0._16_16_;
  if (in_ESI < 0x40) {
    pospopcnt_u16_scalar_naive(in_RDI,in_ESI,in_RDX);
  }
  else {
    local_480 = 0;
    uStack_478 = 0;
    uStack_470 = 0;
    uStack_468 = 0;
    local_d60._0_16_ = ZEXT816(0);
    local_d60 = ZEXT1632(local_d60._0_16_);
    local_d00 = in_RDX;
    local_cf4 = in_ESI;
    local_cf0 = in_RDI;
    memset(local_da0,0,0x40);
    local_da0[4] = *(undefined8 *)local_cf0;
    local_da0[5] = *(undefined8 *)(local_cf0 + 4);
    local_da0[6] = *(undefined8 *)(local_cf0 + 8);
    local_d68 = *(undefined8 *)(local_cf0 + 0xc);
    for (local_da8 = 1; local_da8 < 0x10; local_da8 = local_da8 + 1) {
      lVar1 = local_da8 * 2;
      local_8a8 = (undefined8 *)((long)local_da0 + lVar1);
      local_de0 = *local_8a8;
      uStack_dd8 = *(undefined8 *)((long)local_da0 + lVar1 + 8);
      uStack_dd0 = *(undefined8 *)((long)local_da0 + lVar1 + 0x10);
      uStack_dc8 = *(undefined8 *)((long)local_da0 + lVar1 + 0x18);
      uStack_950 = auStack_d30._0_8_;
      uStack_948 = auStack_d30._8_8_;
      auVar5._8_8_ = uStack_dd8;
      auVar5._0_8_ = local_de0;
      auVar5._16_8_ = uStack_dd0;
      auVar5._24_8_ = uStack_dc8;
      auVar4._16_8_ = auStack_d30._0_8_;
      auVar4._0_16_ = local_d40;
      auVar4._24_8_ = auStack_d30._8_8_;
      local_e00 = vpand_avx2(auVar5,auVar4);
      uStack_4b0 = auStack_d30._0_8_;
      uStack_4a8 = auStack_d30._8_8_;
      local_4e0 = local_e00._0_8_;
      uStack_4d8 = local_e00._8_8_;
      uStack_4d0 = local_e00._16_8_;
      uStack_4c8 = local_e00._24_8_;
      auVar36._16_8_ = auStack_d30._0_8_;
      auVar36._0_16_ = local_d40;
      auVar36._24_8_ = auStack_d30._8_8_;
      uVar6 = vpcmpeqw_avx512vl(auVar36,local_e00);
      local_e20 = vpmovm2w_avx512vl(uVar6);
      local_c0 = local_d60._0_8_;
      uStack_b8 = local_d60._8_8_;
      uStack_b0 = local_d60._16_8_;
      uStack_a8 = local_d60._24_8_;
      local_e0 = local_e20._0_8_;
      uStack_d8 = local_e20._8_8_;
      uStack_d0 = local_e20._16_8_;
      uStack_c8 = local_e20._24_8_;
      local_d60 = vpsubw_avx2(local_d60,local_e20);
      local_940 = local_de0;
      uStack_938 = uStack_dd8;
      uStack_930 = uStack_dd0;
      uStack_928 = uStack_dc8;
      local_960 = local_d40;
      local_4c0 = local_d40;
    }
    memset(local_e60,0,0x40);
    uVar37 = (ulong)local_cf4;
    local_e60[1] = *(undefined8 *)(local_cf0 + (uVar37 - 0xc));
    local_e60[2] = *(undefined8 *)(local_cf0 + (uVar37 - 8));
    local_e60[3] = *(undefined8 *)(local_cf0 + (uVar37 - 4));
    local_e68 = 1;
    while( true ) {
      if (0xf < local_e68) break;
      lVar1 = local_e68 * 2;
      auVar21._8_8_ = *(undefined8 *)((long)local_e60 + lVar1 + 8);
      auVar21._0_8_ = *(undefined8 *)((long)local_e60 + lVar1);
      auVar21._16_8_ = *(undefined8 *)((long)local_e60 + lVar1 + 0x10);
      auVar21._24_8_ = *(undefined8 *)((long)local_e60 + lVar1 + 0x18);
      auVar20._16_8_ = auStack_d30._0_8_;
      auVar20._0_16_ = local_d40;
      auVar20._24_8_ = auStack_d30._8_8_;
      auVar4 = vpand_avx2(auVar21,auVar20);
      auVar35._16_8_ = auStack_d30._0_8_;
      auVar35._0_16_ = local_d40;
      auVar35._24_8_ = auStack_d30._8_8_;
      uVar6 = vpcmpeqw_avx512vl(auVar35,auVar4);
      auVar4 = vpmovm2w_avx512vl(uVar6);
      local_d60 = vpsubw_avx2(local_d60,auVar4);
      local_e68 = local_e68 + 1;
    }
    local_d20 = local_d60._0_8_;
    uStack_d18 = local_d60._8_8_;
    uStack_d10 = local_d60._16_8_;
    uStack_d08 = local_d60._24_8_;
    for (local_ee8 = 0; local_ee8 < 0x10; local_ee8 = local_ee8 + 1) {
      local_d00[local_ee8] =
           (uint)*(ushort *)((long)&local_d20 + local_ee8 * 2) + local_d00[local_ee8];
    }
    local_ef0 = 0;
    while (local_ef0 + 0x10U <= (ulong)local_cf4) {
      local_d60._0_16_ = ZEXT816(0);
      local_d60 = ZEXT1632(local_d60._0_16_);
      local_ef8 = 0;
      local_f00 = 0xffff;
      if ((ulong)local_cf4 <= local_ef0 + 0x1000fU) {
        local_f00 = ((ulong)local_cf4 - local_ef0) - 0xf;
      }
      if (8 < local_f00) {
        for (; local_ef8 < local_f00 - 7; local_ef8 = local_ef8 + 8) {
          auVar19._16_8_ = auStack_d30._0_8_;
          auVar19._0_16_ = local_d40;
          auVar19._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8),auVar19);
          auVar34._16_8_ = auStack_d30._0_8_;
          auVar34._0_16_ = local_d40;
          auVar34._24_8_ = auStack_d30._8_8_;
          auVar4 = vpcmpeqw_avx2(auVar34,auVar4);
          auVar5 = vpsubw_avx2(local_d60,auVar4);
          auVar18._16_8_ = auStack_d30._0_8_;
          auVar18._0_16_ = local_d40;
          auVar18._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8 + 1),auVar18)
          ;
          auVar33._16_8_ = auStack_d30._0_8_;
          auVar33._0_16_ = local_d40;
          auVar33._24_8_ = auStack_d30._8_8_;
          auVar4 = vpcmpeqw_avx2(auVar33,auVar4);
          auVar5 = vpsubw_avx2(auVar5,auVar4);
          auVar17._16_8_ = auStack_d30._0_8_;
          auVar17._0_16_ = local_d40;
          auVar17._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8 + 2),auVar17)
          ;
          auVar32._16_8_ = auStack_d30._0_8_;
          auVar32._0_16_ = local_d40;
          auVar32._24_8_ = auStack_d30._8_8_;
          auVar4 = vpcmpeqw_avx2(auVar32,auVar4);
          auVar5 = vpsubw_avx2(auVar5,auVar4);
          auVar16._16_8_ = auStack_d30._0_8_;
          auVar16._0_16_ = local_d40;
          auVar16._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8 + 3),auVar16)
          ;
          auVar31._16_8_ = auStack_d30._0_8_;
          auVar31._0_16_ = local_d40;
          auVar31._24_8_ = auStack_d30._8_8_;
          auVar4 = vpcmpeqw_avx2(auVar31,auVar4);
          auVar5 = vpsubw_avx2(auVar5,auVar4);
          auVar15._16_8_ = auStack_d30._0_8_;
          auVar15._0_16_ = local_d40;
          auVar15._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8 + 4),auVar15)
          ;
          auVar30._16_8_ = auStack_d30._0_8_;
          auVar30._0_16_ = local_d40;
          auVar30._24_8_ = auStack_d30._8_8_;
          auVar4 = vpcmpeqw_avx2(auVar30,auVar4);
          auVar5 = vpsubw_avx2(auVar5,auVar4);
          auVar14._16_8_ = auStack_d30._0_8_;
          auVar14._0_16_ = local_d40;
          auVar14._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8 + 5),auVar14)
          ;
          auVar29._16_8_ = auStack_d30._0_8_;
          auVar29._0_16_ = local_d40;
          auVar29._24_8_ = auStack_d30._8_8_;
          auVar4 = vpcmpeqw_avx2(auVar29,auVar4);
          auVar5 = vpsubw_avx2(auVar5,auVar4);
          auVar13._16_8_ = auStack_d30._0_8_;
          auVar13._0_16_ = local_d40;
          auVar13._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8 + 6),auVar13)
          ;
          auVar28._16_8_ = auStack_d30._0_8_;
          auVar28._0_16_ = local_d40;
          auVar28._24_8_ = auStack_d30._8_8_;
          auVar4 = vpcmpeqw_avx2(auVar28,auVar4);
          auVar5 = vpsubw_avx2(auVar5,auVar4);
          auVar12._16_8_ = auStack_d30._0_8_;
          auVar12._0_16_ = local_d40;
          auVar12._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8 + 7),auVar12)
          ;
          auVar27._16_8_ = auStack_d30._0_8_;
          auVar27._0_16_ = local_d40;
          auVar27._24_8_ = auStack_d30._8_8_;
          uVar6 = vpcmpeqw_avx512vl(auVar27,auVar4);
          auVar4 = vpmovm2w_avx512vl(uVar6);
          local_d60 = vpsubw_avx2(auVar5,auVar4);
        }
      }
      if (4 < local_f00) {
        for (; local_ef8 + 3 < local_f00; local_ef8 = local_ef8 + 4) {
          auVar11._16_8_ = auStack_d30._0_8_;
          auVar11._0_16_ = local_d40;
          auVar11._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8),auVar11);
          auVar26._16_8_ = auStack_d30._0_8_;
          auVar26._0_16_ = local_d40;
          auVar26._24_8_ = auStack_d30._8_8_;
          auVar4 = vpcmpeqw_avx2(auVar26,auVar4);
          auVar5 = vpsubw_avx2(local_d60,auVar4);
          auVar10._16_8_ = auStack_d30._0_8_;
          auVar10._0_16_ = local_d40;
          auVar10._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8 + 1),auVar10)
          ;
          auVar25._16_8_ = auStack_d30._0_8_;
          auVar25._0_16_ = local_d40;
          auVar25._24_8_ = auStack_d30._8_8_;
          auVar4 = vpcmpeqw_avx2(auVar25,auVar4);
          auVar5 = vpsubw_avx2(auVar5,auVar4);
          auVar9._16_8_ = auStack_d30._0_8_;
          auVar9._0_16_ = local_d40;
          auVar9._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8 + 2),auVar9);
          auVar24._16_8_ = auStack_d30._0_8_;
          auVar24._0_16_ = local_d40;
          auVar24._24_8_ = auStack_d30._8_8_;
          auVar4 = vpcmpeqw_avx2(auVar24,auVar4);
          auVar5 = vpsubw_avx2(auVar5,auVar4);
          auVar8._16_8_ = auStack_d30._0_8_;
          auVar8._0_16_ = local_d40;
          auVar8._24_8_ = auStack_d30._8_8_;
          auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8 + 3),auVar8);
          auVar23._16_8_ = auStack_d30._0_8_;
          auVar23._0_16_ = local_d40;
          auVar23._24_8_ = auStack_d30._8_8_;
          uVar6 = vpcmpeqw_avx512vl(auVar23,auVar4);
          auVar4 = vpmovm2w_avx512vl(uVar6);
          local_d60 = vpsubw_avx2(auVar5,auVar4);
        }
      }
      while( true ) {
        if (local_f00 <= local_ef8) break;
        auVar7._16_8_ = auStack_d30._0_8_;
        auVar7._0_16_ = local_d40;
        auVar7._24_8_ = auStack_d30._8_8_;
        auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_cf0 + local_ef0 + local_ef8),auVar7);
        auVar22._16_8_ = auStack_d30._0_8_;
        auVar22._0_16_ = local_d40;
        auVar22._24_8_ = auStack_d30._8_8_;
        uVar6 = vpcmpeqw_avx512vl(auVar22,auVar4);
        auVar4 = vpmovm2w_avx512vl(uVar6);
        local_d60 = vpsubw_avx2(local_d60,auVar4);
        local_ef8 = local_ef8 + 1;
      }
      local_ef0 = local_ef8 + local_ef0;
      local_d20 = local_d60._0_8_;
      uStack_d18 = local_d60._8_8_;
      uStack_d10 = local_d60._16_8_;
      uStack_d08 = local_d60._24_8_;
      for (local_13e8 = 0; local_13e8 < 0x10; local_13e8 = local_13e8 + 1) {
        local_d00[local_13e8] =
             (uint)*(ushort *)((long)&local_d20 + local_13e8 * 2) + local_d00[local_13e8];
      }
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_lemire2(const uint16_t* array, uint32_t len, uint32_t* flags) {
    uint16_t buffer[16];
    __m256i bits = _mm256_set_epi16(-32768, 16384, 8192, 4096, 2048, 1024, 512, 256, 
                                       128,    64,   32,   16,    8,    4,   2,   1);
    // we do the first part
    if (len < 64) {
        // don't bother with handcrafted SIMD
        pospopcnt_u16_scalar_naive(array, len, flags);
        return 0;
    }
    // handle the start (naively)
    __m256i count16 = _mm256_setzero_si256();

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer + 16, array, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer, array + len - 16, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }

    _mm256_storeu_si256((__m256i*)buffer, count16);
    for (size_t k = 0; k < 16; k++) {
        flags[k] += buffer[k];
    }

    // main loop starts here
    for (size_t i = 0; i + 16 <= len;) {
        count16 = _mm256_setzero_si256();
        size_t j = 0;
        size_t maxj = 65535;

        if (maxj + i + 16 >= len)
            maxj = len - i - 15;

        if (maxj > 8) {
            for (/**/; j < maxj - 7; j += 8) {
                __m256i input1 = _mm256_loadu_si256((__m256i*)(array + i + j));
                __m256i m1  = _mm256_and_si256(input1, bits);
                __m256i eq1 = _mm256_cmpeq_epi16(bits, m1);
                count16 = _mm256_sub_epi16(count16, eq1);
                __m256i input2 = _mm256_loadu_si256((__m256i*)(array + i + j + 1));
                __m256i m2  = _mm256_and_si256(input2, bits);
                __m256i eq2 = _mm256_cmpeq_epi16(bits, m2);
                count16 = _mm256_sub_epi16(count16, eq2);
                __m256i input3 = _mm256_loadu_si256((__m256i*)(array + i + j + 2));
                __m256i m3  = _mm256_and_si256(input3, bits);
                __m256i eq3 = _mm256_cmpeq_epi16(bits, m3);
                count16 = _mm256_sub_epi16(count16, eq3);
                __m256i input4 = _mm256_loadu_si256((__m256i*)(array + i + j + 3));
                __m256i m4  = _mm256_and_si256(input4, bits);
                __m256i eq4 = _mm256_cmpeq_epi16(bits, m4);
                count16 = _mm256_sub_epi16(count16, eq4);
                __m256i input5 = _mm256_loadu_si256((__m256i*)(array + i + j + 4));
                __m256i m5  = _mm256_and_si256(input5, bits);
                __m256i eq5 = _mm256_cmpeq_epi16(bits, m5);
                count16 = _mm256_sub_epi16(count16, eq5);
                __m256i input6 = _mm256_loadu_si256((__m256i*)(array + i + j + 5));
                __m256i m6  = _mm256_and_si256(input6, bits);
                __m256i eq6 = _mm256_cmpeq_epi16(bits, m6);
                count16 = _mm256_sub_epi16(count16, eq6);
                __m256i input7 = _mm256_loadu_si256((__m256i*)(array + i + j + 6));
                __m256i m7  = _mm256_and_si256(input7, bits);
                __m256i eq7 = _mm256_cmpeq_epi16(bits, m7);
                count16 = _mm256_sub_epi16(count16, eq7);
                __m256i input8 = _mm256_loadu_si256((__m256i*)(array + i + j + 7));
                __m256i m8  = _mm256_and_si256(input8, bits);
                __m256i eq8 = _mm256_cmpeq_epi16(bits, m8);
                count16 = _mm256_sub_epi16(count16, eq8);
            }
        }

        if (maxj > 4) {
            for (/**/; j + 3 < maxj; j += 4) {
                __m256i input1 = _mm256_loadu_si256((__m256i*)(array + i + j));
                __m256i m1  = _mm256_and_si256(input1, bits);
                __m256i eq1 = _mm256_cmpeq_epi16(bits, m1);
                count16 = _mm256_sub_epi16(count16, eq1);
                __m256i input2 = _mm256_loadu_si256((__m256i*)(array + i + j + 1));
                __m256i m2  = _mm256_and_si256(input2, bits);
                __m256i eq2 = _mm256_cmpeq_epi16(bits, m2);
                count16 = _mm256_sub_epi16(count16, eq2);
                __m256i input3 = _mm256_loadu_si256((__m256i*)(array + i + j + 2));
                __m256i m3  = _mm256_and_si256(input3, bits);
                __m256i eq3 = _mm256_cmpeq_epi16(bits, m3);
                count16 = _mm256_sub_epi16(count16, eq3);
                __m256i input4 = _mm256_loadu_si256((__m256i*)(array + i + j + 3));
                __m256i m4  = _mm256_and_si256(input4, bits);
                __m256i eq4 = _mm256_cmpeq_epi16(bits, m4);
                count16 = _mm256_sub_epi16(count16, eq4);
            }
        }
        for (/**/; j < maxj; ++j) {
            __m256i input = _mm256_loadu_si256((__m256i*)(array + i + j));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
        i += j;

        _mm256_storeu_si256((__m256i*)buffer, count16);
        for (size_t k = 0; k < 16; k++) {
            flags[k] += buffer[k];
        }
    }
    return 0;
}